

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::ReservoirSample::Copy(ReservoirSample *this)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var2;
  __uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> __p;
  undefined8 __p_00;
  pointer pRVar3;
  DataChunk *pDVar4;
  idx_t iVar5;
  pointer pRVar6;
  DataChunk *other;
  pointer *__ptr;
  ReservoirSample *in_RSI;
  idx_t i;
  idx_t iVar7;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
  new_sample_chunk;
  vector<duckdb::LogicalType,_true> types;
  SelectionVector sel_copy;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> local_88;
  __uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> local_80;
  undefined1 local_78 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  SelectionVector local_48;
  
  make_uniq<duckdb::ReservoirSample,unsigned_long_const&>((duckdb *)&local_88,&in_RSI->sample_count)
  ;
  bVar1 = in_RSI->stats_sample;
  pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_88);
  pRVar3->stats_sample = bVar1;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  ::operator->(&(in_RSI->super_BlockingSample).base_reservoir_sample);
  BaseReservoirSampling::Copy((BaseReservoirSampling *)local_78);
  pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_88);
  __p_00 = local_78._0_8_;
  local_78._0_8_ = 0;
  ::std::
  __uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
  ::reset((__uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
           *)&(pRVar3->super_BlockingSample).base_reservoir_sample,(pointer)__p_00);
  ::std::
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
               *)local_78);
  bVar1 = (in_RSI->super_BlockingSample).destroyed;
  pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                       *)&local_88);
  (pRVar3->super_BlockingSample).destroyed = bVar1;
  if (((in_RSI->reservoir_chunk).
       super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
       super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
       .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl == (ReservoirChunk *)0x0
      ) || ((in_RSI->super_BlockingSample).destroyed == true)) {
    (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)local_88._M_head_impl;
  }
  else {
    pDVar4 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              ::operator->(&in_RSI->reservoir_chunk)->chunk;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_78,pDVar4);
    iVar5 = GetActiveSampleCount(in_RSI);
    if (in_RSI->sample_count <= iVar5) {
      iVar5 = in_RSI->sample_count;
    }
    CreateNewSampleChunk
              ((ReservoirSample *)&local_80,(vector<duckdb::LogicalType,_true> *)in_RSI,
               (idx_t)local_78);
    SelectionVector::SelectionVector(&local_48,&in_RSI->sel);
    pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_88);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>.
    super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl =
         local_80._M_t.
         super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
         .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl;
    local_80._M_t.
    super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>.
    super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl =
         (tuple<duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>)
         (_Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>)
         0x0;
    ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    reset((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
          &pRVar3->reservoir_chunk,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
                   .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl);
    pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_88);
    pRVar6 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_88);
    pDVar4 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              ::operator->(&pRVar6->reservoir_chunk)->chunk;
    other = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(&in_RSI->reservoir_chunk)->chunk;
    UpdateSampleAppend(pRVar3,pDVar4,other,&local_48,iVar5);
    SelectionVector::SelectionVector((SelectionVector *)(local_78 + 0x18),iVar5);
    pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_88);
    SelectionVector::operator=(&pRVar3->sel,(SelectionVector *)(local_78 + 0x18));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    for (iVar7 = 0; iVar5 != iVar7; iVar7 = iVar7 + 1) {
      pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                             *)&local_88);
      (pRVar3->sel).sel_vector[iVar7] = (sel_t)iVar7;
    }
    iVar5 = in_RSI->sel_size;
    pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                           *)&local_88);
    pRVar3->sel_size = iVar5;
    unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
    operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                *)&local_88);
    _Var2._M_head_impl = local_88._M_head_impl;
    local_88._M_head_impl = (ReservoirSample *)0x0;
    (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)_Var2._M_head_impl;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    ~unique_ptr((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
                &local_80);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_78);
    if (local_88._M_head_impl != (ReservoirSample *)0x0) {
      (*((local_88._M_head_impl)->super_BlockingSample)._vptr_BlockingSample[1])();
    }
  }
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> ReservoirSample::Copy() const {

	auto ret = make_uniq<ReservoirSample>(sample_count);
	ret->stats_sample = stats_sample;

	ret->base_reservoir_sample = base_reservoir_sample->Copy();
	ret->destroyed = destroyed;

	if (!reservoir_chunk || destroyed) {
		return unique_ptr_cast<ReservoirSample, BlockingSample>(std::move(ret));
	}

	D_ASSERT(reservoir_chunk);

	// create a new sample chunk to store new samples
	auto types = reservoir_chunk->chunk.GetTypes();
	// how many values should be copied
	idx_t values_to_copy = MinValue<idx_t>(GetActiveSampleCount(), sample_count);

	auto new_sample_chunk = CreateNewSampleChunk(types, GetReservoirChunkCapacity<idx_t>());

	SelectionVector sel_copy(sel);

	ret->reservoir_chunk = std::move(new_sample_chunk);
	ret->UpdateSampleAppend(ret->reservoir_chunk->chunk, reservoir_chunk->chunk, sel_copy, values_to_copy);
	ret->sel = SelectionVector(values_to_copy);
	for (idx_t i = 0; i < values_to_copy; i++) {
		ret->sel.set_index(i, i);
	}
	ret->sel_size = sel_size;
	D_ASSERT(ret->reservoir_chunk->chunk.size() <= sample_count);
	ret->Verify();
	return unique_ptr_cast<ReservoirSample, BlockingSample>(std::move(ret));
}